

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer
          (TPZTransfer<std::complex<float>_> *this,TPZBlock *row,TPZBlock *col,int nvar,
          int nrowblocks,int ncolblocks)

{
  undefined4 in_ECX;
  TPZRegisterClassId *in_RDI;
  TPZBlock *this_00;
  TPZVec<int> *this_01;
  undefined4 in_R8D;
  undefined4 in_R9D;
  void **in_stack_ffffffffffffff88;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffff90;
  TPZBlock *in_stack_ffffffffffffffa0;
  int ncolblocks_00;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  TPZBlock *in_stack_ffffffffffffffc0;
  TPZBlock *row_00;
  TPZTransfer<std::complex<float>_> *this_02;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_02 = (TPZTransfer<std::complex<float>_> *)0x0;
  row_00 = (TPZBlock *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZTransfer<std::complex<float>>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<std::complex<float>_>::TPZMatrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined ***)in_RDI = &PTR__TPZTransfer_023eec30;
  *(undefined4 *)(in_RDI + 0x1c) = in_ECX;
  ncolblocks_00 = (int)((ulong)(in_RDI + 0x20) >> 0x20);
  TPZBlock::TPZBlock(in_stack_ffffffffffffffa0);
  this_00 = (TPZBlock *)(in_RDI + 0xf0);
  TPZBlock::TPZBlock(this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x1c0);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x1e0));
  TPZManVector<int,_10>::TPZManVector((TPZManVector<int,_10> *)this_00,(int64_t)this_01);
  TPZManVector<int,_10>::TPZManVector((TPZManVector<int,_10> *)this_00,(int64_t)this_01);
  *(undefined4 *)(in_RDI + 0x290) = 0;
  TPZManVector<std::complex<float>,_10>::TPZManVector
            ((TPZManVector<std::complex<float>,_10> *)CONCAT44(in_ECX,in_R8D),
             CONCAT44(in_R9D,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x308) = 0;
  SetBlocks(this_02,row_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
            in_stack_ffffffffffffffb8,ncolblocks_00);
  return;
}

Assistant:

TPZTransfer<TVar>::TPZTransfer(TPZBlock &row, TPZBlock &col,int nvar, int nrowblocks, int ncolblocks) :
                                                        TPZRegisterClassId(&TPZTransfer::ClassId),
                                                        TPZMatrix<TVar>(), fNTVarVar(nvar), fRowBlock(), fColBlock(),
                                                        fColPosition(), fNumberofColumnBlocks(),
                                                        fColumnBlockPosition(0),fColumnBlockNumber(0),
                                                        fColumnBlockLastUsed(0),fDoubleValues(0),fDoubleValLastUsed(0)
{
	SetBlocks(row,col,nvar,nrowblocks,ncolblocks);
}